

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v2.cpp
# Opt level: O0

void __thiscall
intel_keym_v2_t::intel_keym_v2_t
          (intel_keym_v2_t *this,kstream *p__io,kstruct *p__parent,intel_keym_v2_t *p__root)

{
  intel_keym_v2_t *p__root_local;
  kstruct *p__parent_local;
  kstream *p__io_local;
  intel_keym_v2_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__intel_keym_v2_t_0037b960;
  std::unique_ptr<intel_keym_v2_t::header_t,std::default_delete<intel_keym_v2_t::header_t>>::
  unique_ptr<std::default_delete<intel_keym_v2_t::header_t>,void>
            ((unique_ptr<intel_keym_v2_t::header_t,std::default_delete<intel_keym_v2_t::header_t>> *
             )&this->m_header);
  std::
  unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::unique_ptr<std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&this->m_reserved);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,std::default_delete<intel_keym_v2_t::km_hash_t>>,std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,std::default_delete<intel_keym_v2_t::km_hash_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,std::default_delete<intel_keym_v2_t::km_hash_t>>,std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,std::default_delete<intel_keym_v2_t::km_hash_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,std::default_delete<intel_keym_v2_t::km_hash_t>>,std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,std::default_delete<intel_keym_v2_t::km_hash_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,std::default_delete<intel_keym_v2_t::km_hash_t>>,std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,std::default_delete<intel_keym_v2_t::km_hash_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,std::default_delete<intel_keym_v2_t::km_hash_t>>,std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,std::default_delete<intel_keym_v2_t::km_hash_t>>>>>>
              *)&this->m_km_hashes);
  std::
  unique_ptr<intel_keym_v2_t::key_signature_t,std::default_delete<intel_keym_v2_t::key_signature_t>>
  ::unique_ptr<std::default_delete<intel_keym_v2_t::key_signature_t>,void>
            ((unique_ptr<intel_keym_v2_t::key_signature_t,std::default_delete<intel_keym_v2_t::key_signature_t>>
              *)&this->m_key_signature);
  this->m__parent = p__parent;
  this->m__root = this;
  std::unique_ptr<intel_keym_v2_t::header_t,_std::default_delete<intel_keym_v2_t::header_t>_>::
  operator=(&this->m_header,(nullptr_t)0x0);
  std::
  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&this->m_reserved,(nullptr_t)0x0);
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>,_std::allocator<std::unique_ptr<intel_keym_v2_t::km_hash_t,_std::default_delete<intel_keym_v2_t::km_hash_t>_>_>_>_>_>
  ::operator=(&this->m_km_hashes,(nullptr_t)0x0);
  std::
  unique_ptr<intel_keym_v2_t::key_signature_t,_std::default_delete<intel_keym_v2_t::key_signature_t>_>
  ::operator=(&this->m_key_signature,(nullptr_t)0x0);
  _read(this);
  return;
}

Assistant:

intel_keym_v2_t::intel_keym_v2_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, intel_keym_v2_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    m_header = nullptr;
    m_reserved = nullptr;
    m_km_hashes = nullptr;
    m_key_signature = nullptr;
    _read();
}